

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::init
          (ConcurrentImageAtomicCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *pRVar1;
  Context *pCVar2;
  TestLog *pTVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *pSVar8;
  ostream *poVar9;
  ProgramSources *pPVar10;
  TestError *pTVar11;
  NotSupportedError *this_00;
  char *code;
  int ndx;
  string local_2f8;
  Context *local_2d8 [4];
  ScopedLogSection section;
  string local_2b0 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  ProgramSources local_278;
  deUint32 buffer;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  buffer = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&zeroData,(long)(this->m_workSize * this->m_workSize),&buffer,
             (allocator_type *)&local_278);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_OES_shader_image_atomic");
    if (!bVar4) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"Test requires GL_OES_shader_image_atomic",
                 (allocator<char> *)&local_278);
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)&buffer);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (**(code **)(lVar7 + 0x6f8))(1,&this->m_imageID);
  (**(code **)(lVar7 + 0xb8))(0xde1,this->m_imageID);
  (**(code **)(lVar7 + 0x1380))(0xde1,1,0x8236,this->m_workSize,this->m_workSize);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  code = (char *)0xa5c;
  glu::checkError(dVar6,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xa5c);
  for (iVar5 = 0; iVar5 < this->m_numCalls; iVar5 = iVar5 + 1) {
    buffer = 0;
    (**(code **)(lVar7 + 0x6c8))(1,&buffer);
    (**(code **)(lVar7 + 0x40))(0x90d2,buffer);
    (**(code **)(lVar7 + 0x150))
              (0x90d2,(long)this->m_workSize * (long)this->m_workSize * 4,
               zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88ea);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_intermediateResultBuffers,&buffer);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    code = (char *)0xa69;
    glu::checkError(dVar6,"gen buffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0xa69);
  }
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_278,0,0xac);
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_278._193_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer);
  poVar9 = std::operator<<((ostream *)&buffer,"${GLSL_VERSION_DECL}\n");
  poVar9 = std::operator<<(poVar9,"${SHADER_IMAGE_ATOMIC_REQUIRE}\n");
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar9 = std::operator<<(poVar9,
                           "layout (binding = 1, std430) writeonly buffer IntermediateResults\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  poVar9 = std::operator<<(poVar9,"\thighp uint values[");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_workSize * this->m_workSize);
  poVar9 = std::operator<<(poVar9,"];\n");
  poVar9 = std::operator<<(poVar9,"} sb_ires;\n");
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,
                           "layout (binding = 2, r32ui) volatile uniform highp uimage2D u_workImage;\n"
                          );
  poVar9 = std::operator<<(poVar9,"uniform highp uint u_atomicDelta;\n");
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"void main ()\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  poVar9 = std::operator<<(poVar9,
                           "\thighp uint invocationIndex = gl_GlobalInvocationID.x + gl_GlobalInvocationID.y * uint("
                          );
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_workSize);
  poVar9 = std::operator<<(poVar9,");\n");
  poVar9 = std::operator<<(poVar9,
                           "\tsb_ires.values[invocationIndex] = imageAtomicAdd(u_workImage, ivec2(gl_GlobalInvocationID.xy), u_atomicDelta);\n"
                          );
  std::operator<<(poVar9,"}");
  pCVar2 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f8,(_anonymous_namespace_ *)pCVar2,local_2d8[0],code);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buffer);
  glu::ComputeSource::ComputeSource((ComputeSource *)&section,&local_2f8);
  pPVar10 = glu::ProgramSources::operator<<(&local_278,(ShaderSource *)&section);
  glu::ShaderProgram::ShaderProgram(pSVar8,pRVar1,pPVar10);
  this->m_program = pSVar8;
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string((string *)&local_2f8);
  glu::ProgramSources::~ProgramSources(&local_278);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buffer,"could not build program",(allocator<char> *)&local_278);
    tcu::TestError::TestError(pTVar11,(string *)&buffer);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_278,0,0xac);
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_278._193_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer);
  poVar9 = std::operator<<((ostream *)&buffer,"${GLSL_VERSION_DECL}\n");
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar9 = std::operator<<(poVar9,"layout (binding = 1, std430) writeonly buffer ImageValues\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  poVar9 = std::operator<<(poVar9,"\thighp uint values[");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_workSize * this->m_workSize);
  poVar9 = std::operator<<(poVar9,"];\n");
  poVar9 = std::operator<<(poVar9,"} sb_res;\n");
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,
                           "layout (binding = 2, r32ui) readonly uniform highp uimage2D u_workImage;\n"
                          );
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"void main ()\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  poVar9 = std::operator<<(poVar9,
                           "\thighp uint invocationIndex = gl_GlobalInvocationID.x + gl_GlobalInvocationID.y * uint("
                          );
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_workSize);
  poVar9 = std::operator<<(poVar9,");\n");
  poVar9 = std::operator<<(poVar9,
                           "\tsb_res.values[invocationIndex] = imageLoad(u_workImage, ivec2(gl_GlobalInvocationID.xy)).x;\n"
                          );
  std::operator<<(poVar9,"}");
  pCVar2 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f8,(_anonymous_namespace_ *)pCVar2,local_2d8[0],code);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buffer);
  glu::ComputeSource::ComputeSource((ComputeSource *)&section,&local_2f8);
  pPVar10 = glu::ProgramSources::operator<<(&local_278,(ShaderSource *)&section);
  glu::ShaderProgram::ShaderProgram(pSVar8,pRVar1,pPVar10);
  this->m_imageReadProgram = pSVar8;
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string((string *)&local_2f8);
  glu::ProgramSources::~ProgramSources(&local_278);
  if ((this->m_imageReadProgram->m_program).m_info.linkOk == false) {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buffer,"ImageReadProgram",(allocator<char> *)local_2d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Image read program",(allocator<char> *)&local_2f8);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)&buffer,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&buffer);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    this->m_imageReadProgram);
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buffer,"could not build program",(allocator<char> *)&local_278);
    tcu::TestError::TestError(pTVar11,(string *)&buffer);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_278,0,0xac);
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_278._193_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer);
  poVar9 = std::operator<<((ostream *)&buffer,"${GLSL_VERSION_DECL}\n");
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar9 = std::operator<<(poVar9,
                           "layout (binding = 2, r32ui) writeonly uniform highp uimage2D u_workImage;\n"
                          );
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"void main ()\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  poVar9 = std::operator<<(poVar9,
                           "\timageStore(u_workImage, ivec2(gl_GlobalInvocationID.xy), uvec4(0, 0, 0, 0));\n"
                          );
  std::operator<<(poVar9,"}");
  pCVar2 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f8,(_anonymous_namespace_ *)pCVar2,local_2d8[0],code);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buffer);
  glu::ComputeSource::ComputeSource((ComputeSource *)&section,&local_2f8);
  pPVar10 = glu::ProgramSources::operator<<(&local_278,(ShaderSource *)&section);
  glu::ShaderProgram::ShaderProgram(pSVar8,pRVar1,pPVar10);
  this->m_imageClearProgram = pSVar8;
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string((string *)&local_2f8);
  glu::ProgramSources::~ProgramSources(&local_278);
  if ((this->m_imageClearProgram->m_program).m_info.linkOk != false) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return extraout_EAX;
  }
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buffer,"ImageClearProgram",(allocator<char> *)local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Image read program",(allocator<char> *)&local_2f8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)&buffer,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&buffer);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_imageClearProgram);
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buffer,"could not build program",(allocator<char> *)&local_278);
  tcu::TestError::TestError(pTVar11,(string *)&buffer);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConcurrentImageAtomicCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	std::vector<deUint32>	zeroData			(m_workSize * m_workSize, 0);
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic");

	// gen image

	gl.genTextures(1, &m_imageID);
	gl.bindTexture(GL_TEXTURE_2D, m_imageID);
	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_workSize, m_workSize);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

	// gen buffers

	for (int ndx = 0; ndx < m_numCalls; ++ndx)
	{
		deUint32 buffer = 0;

		gl.genBuffers(1, &buffer);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32) * m_workSize * m_workSize, &zeroData[0], GL_DYNAMIC_COPY);

		m_intermediateResultBuffers.push_back(buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");
	}

	// gen programs

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource()));
	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		throw tcu::TestError("could not build program");

	m_imageReadProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genImageReadSource()));
	if (!m_imageReadProgram->isOk())
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ImageReadProgram", "Image read program");

		m_testCtx.getLog() << *m_imageReadProgram;
		throw tcu::TestError("could not build program");
	}

	m_imageClearProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genImageClearSource()));
	if (!m_imageClearProgram->isOk())
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ImageClearProgram", "Image read program");

		m_testCtx.getLog() << *m_imageClearProgram;
		throw tcu::TestError("could not build program");
	}
}